

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void closePendingFds(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  UnixUnusedFd *p;
  
  puVar1 = pFile->pInode;
  p = puVar1->pUnused;
  while (p != (UnixUnusedFd *)0x0) {
    pUVar2 = p->pNext;
    robust_close(pFile,p->fd,0x8fb3);
    sqlite3_free(p);
    p = pUVar2;
  }
  puVar1->pUnused = (UnixUnusedFd *)0x0;
  return;
}

Assistant:

static void closePendingFds(unixFile *pFile){
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  assert( unixFileMutexHeld(pFile) );
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    robust_close(pFile, p->fd, __LINE__);
    sqlite3_free(p);
  }
  pInode->pUnused = 0;
}